

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferTestUtil.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::BufferTestUtil::VertexArrayVerifier::verify
          (VertexArrayVerifier *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  CallLogWrapper *pCVar1;
  long *plVar2;
  deUint32 dVar3;
  RenderContext *context;
  long lVar4;
  ulong uVar5;
  uchar *puVar6;
  bool bVar7;
  int i_4;
  int iVar8;
  uint uVar9;
  undefined4 extraout_var;
  undefined8 *puVar11;
  TextureFormat *pTVar12;
  RGBA *pRVar13;
  TextureFormat TVar14;
  RGBA *pRVar15;
  unsigned_short uVar16;
  uint uVar17;
  int x;
  byte bVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  ulong uVar25;
  uint uVar26;
  void *pvVar27;
  int y;
  long lVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  Vec4 v00;
  Vec4 v01;
  Vec4 color;
  Vec4 v10;
  Vec4 v11;
  string imageSetDesc;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> positions;
  RGBA threshold;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  Surface reference;
  Surface rendered;
  Vector<float,_4> res;
  PixelBufferAccess dstAccess;
  uint local_3b4;
  undefined1 local_3b0 [8];
  undefined8 uStack_3a8;
  ulong local_3a0;
  TextureFormat TStack_398;
  uint local_38c;
  ulong local_388;
  CallLogWrapper *local_380;
  undefined8 local_378;
  long local_370;
  ulong local_368 [2];
  Vec4 local_358;
  ulong local_348 [2];
  undefined8 local_338;
  undefined8 local_330;
  long local_328;
  undefined8 uStack_320;
  RGBA local_318;
  undefined4 uStack_314;
  long local_310;
  ulong local_308 [2];
  long *local_2f8;
  undefined8 local_2f0;
  long local_2e8;
  undefined8 uStack_2e0;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_2d8;
  ulong local_2b8;
  uint local_2b0;
  uint local_2ac;
  int local_2a8;
  uint local_2a4;
  int local_2a0;
  RGBA local_29c;
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_278;
  uchar *local_260;
  size_t local_258;
  uchar *local_250;
  ulong local_248;
  Surface local_240;
  Surface local_228;
  ulong local_210;
  uchar *local_208;
  ulong local_200;
  float local_1f8 [20];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  int *piVar10;
  
  local_260 = sig;
  local_258 = siglen;
  local_250 = tbs;
  iVar8 = (*((this->super_BufferVerifierBase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  piVar10 = (int *)CONCAT44(extraout_var,iVar8);
  iVar8 = *piVar10;
  iVar20 = iVar8 + 7;
  if (-1 < iVar8) {
    iVar20 = iVar8;
  }
  iVar22 = piVar10[1];
  uVar17 = iVar20 >> 3;
  if (0x7f < iVar20 >> 3) {
    uVar17 = 0x80;
  }
  local_388 = (ulong)uVar17;
  iVar20 = iVar22 + 7;
  if (-1 < iVar22) {
    iVar20 = iVar22;
  }
  uVar17 = iVar20 >> 3;
  if (0x7f < iVar20 >> 3) {
    uVar17 = 0x80;
  }
  bVar18 = 8 - (char)piVar10[2];
  uVar9 = 0x1000000 << (8U - (char)piVar10[5] & 0x1f);
  if (piVar10[5] < 1) {
    uVar9 = 0;
  }
  uVar26 = 0x100 << (8U - (char)piVar10[3] & 0x1f) | 1 << (bVar18 & 0x1f);
  uVar9 = 0x10000 << (8U - (char)piVar10[4] & 0x1f) | uVar26 | uVar9;
  uVar23 = 1 << (bVar18 & 0x1f) & 0xff;
  if (0xfa < uVar23) {
    uVar23 = 0xfb;
  }
  dVar3 = (this->m_program->m_program).m_program;
  uVar26 = uVar26 >> 8 & 0xff;
  if (0xfa < uVar26) {
    uVar26 = 0xfb;
  }
  uVar19 = uVar9 >> 0x10 & 0xff;
  if (0xfa < uVar19) {
    uVar19 = 0xfb;
  }
  uVar9 = uVar9 >> 0x18;
  if (0xfa < uVar9) {
    uVar9 = 0xfb;
  }
  local_29c.m_value = uVar9 * 0x1000000 + (uVar19 << 0x10 | uVar26 << 8 | uVar23) + 0x4040404;
  local_2d8.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  tcu::Surface::Surface(&local_228);
  local_298._0_4_ = dVar3;
  tcu::Surface::Surface(&local_240);
  uVar9 = uVar17 * (int)local_388;
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::resize
            (&local_2d8,(long)(int)(uVar9 * 4));
  if (7 < iVar22) {
    fVar29 = (float)(int)local_388;
    uVar23 = 0;
    iVar20 = 3;
    do {
      if (7 < iVar8) {
        fVar30 = (float)(int)uVar23 / (float)(int)uVar17;
        fVar31 = (float)(int)(uVar23 + 1) / (float)(int)uVar17;
        fVar30 = fVar30 + fVar30 + -1.0;
        fVar31 = fVar31 + fVar31 + -1.0;
        uVar25 = 0;
        iVar22 = iVar20;
        do {
          iVar24 = (int)uVar25;
          uVar25 = uVar25 + 1;
          fVar32 = (float)iVar24 / fVar29;
          fVar33 = (float)(int)uVar25 / fVar29;
          fVar32 = fVar32 + fVar32 + -1.0;
          fVar33 = fVar33 + fVar33 + -1.0;
          local_2d8.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start[iVar22 + -3].m_data[0] = fVar32;
          local_2d8.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start[iVar22 + -3].m_data[1] = fVar30;
          local_2d8.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start[iVar22 + -2].m_data[0] = fVar32;
          local_2d8.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start[iVar22 + -2].m_data[1] = fVar31;
          local_2d8.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start[iVar22 + -1].m_data[0] = fVar33;
          local_2d8.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start[iVar22 + -1].m_data[1] = fVar30;
          local_2d8.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start[iVar22].m_data[0] = fVar33;
          local_2d8.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start[iVar22].m_data[1] = fVar31;
          iVar22 = iVar22 + 4;
        } while ((local_388 & 0xffffffff) != uVar25);
      }
      uVar23 = uVar23 + 1;
      iVar20 = iVar20 + (int)local_388 * 4;
    } while (uVar23 != uVar17);
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&local_278,(long)(int)(uVar9 * 6));
  if (0 < (int)uVar9) {
    uVar16 = 3;
    lVar21 = 0;
    do {
      iVar8 = (int)lVar21;
      local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[iVar8] = uVar16 - 1;
      local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[iVar8 + 1] = uVar16 - 3;
      local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[iVar8 + 2] = uVar16 - 2;
      local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[iVar8 + 3] = uVar16 - 1;
      local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[iVar8 + 4] = uVar16 - 2;
      local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[iVar8 + 5] = uVar16;
      lVar21 = lVar21 + 6;
      uVar16 = uVar16 + 4;
    } while ((ulong)uVar9 * 6 != lVar21);
  }
  pCVar1 = &(this->super_BufferVerifierBase).super_CallLogWrapper;
  glu::CallLogWrapper::glBindBuffer(pCVar1,0x8893,0);
  glu::CallLogWrapper::glBindBuffer(pCVar1,0x8892,0);
  glu::CallLogWrapper::glViewport(pCVar1,0,0,(int)local_388 * 8,uVar17 << 3);
  glu::CallLogWrapper::glClearColor(pCVar1,0.0,0.0,0.0,1.0);
  glu::CallLogWrapper::glUseProgram(pCVar1,local_298._0_4_);
  glu::CallLogWrapper::glEnableVertexAttribArray(pCVar1,this->m_posLoc);
  glu::CallLogWrapper::glVertexAttribPointer
            (pCVar1,this->m_posLoc,2,0x1406,'\0',0,
             local_2d8.
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glEnableVertexAttribArray(pCVar1,this->m_byteVecLoc);
  glu::CallLogWrapper::glBindBuffer(pCVar1,0x8892,(GLuint)ctx);
  local_2ac = uVar9 * 0xc;
  local_2b0 = (int)local_250 - 0xc;
  local_260 = local_260 + (int)local_258;
  local_3b4 = (uint)CONCAT71((int7)(int3)(local_258 >> 8),1);
  uVar17 = 0;
  local_380 = pCVar1;
  do {
    uVar9 = (int)local_250 - uVar17;
    if (uVar9 == 0 || (int)local_250 < (int)uVar17) break;
    uVar25 = 0xc;
    local_38c = uVar9;
    local_288._0_4_ = local_2b0;
    if (0xb < (int)uVar9) {
      local_38c = (uVar9 / 0xc) * 0xc;
      if (SBORROW4(local_2ac,local_38c) != (int)(local_2ac + (uVar9 / 0xc) * -0xc) < 0) {
        local_38c = local_2ac;
      }
      uVar25 = (ulong)local_38c;
      local_288._0_4_ = uVar17;
    }
    local_288._4_4_ = 0;
    local_298._0_8_ = uVar25;
    uVar9 = (int)uVar25 / 0xc;
    iVar8 = (int)local_388;
    local_248 = (ulong)uVar9;
    if (iVar8 < (int)uVar9) {
      local_248 = local_388 & 0xffffffff;
    }
    local_2a0 = ((int)uVar9 / iVar8 + 1) - (uint)((int)uVar9 % iVar8 == 0);
    local_378 = local_368;
    local_2a4 = uVar17;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"Bytes ","");
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    iVar8 = local_288._0_4_ + (int)local_258;
    std::ostream::operator<<(local_1a8,iVar8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar25 = 0xf;
    if (local_378 != local_368) {
      uVar25 = local_368[0];
    }
    if (uVar25 < (ulong)(local_310 + local_370)) {
      uVar25 = 0xf;
      if ((ulong *)CONCAT44(uStack_314,local_318.m_value) != local_308) {
        uVar25 = local_308[0];
      }
      if (uVar25 < (ulong)(local_310 + local_370)) goto LAB_003f7ebb;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_318,0,(char *)0x0,(ulong)local_378);
    }
    else {
LAB_003f7ebb:
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_378,CONCAT44(uStack_314,local_318.m_value));
    }
    local_338 = &local_328;
    plVar2 = puVar11 + 2;
    if ((long *)*puVar11 == plVar2) {
      local_328 = *plVar2;
      uStack_320 = puVar11[3];
    }
    else {
      local_328 = *plVar2;
      local_338 = (long *)*puVar11;
    }
    local_330 = puVar11[1];
    *puVar11 = plVar2;
    puVar11[1] = 0;
    *(undefined1 *)plVar2 = 0;
    pTVar12 = (TextureFormat *)std::__cxx11::string::append((char *)&local_338);
    local_3b0 = (undefined1  [8])&local_3a0;
    TVar14 = (TextureFormat)(pTVar12 + 2);
    if (*pTVar12 == TVar14) {
      local_3a0 = *(ulong *)TVar14;
      TStack_398 = pTVar12[3];
    }
    else {
      local_3a0 = *(ulong *)TVar14;
      local_3b0 = (undefined1  [8])*pTVar12;
    }
    uStack_3a8 = pTVar12[1];
    *pTVar12 = TVar14;
    pTVar12[1].order = R;
    pTVar12[1].type = SNORM_INT8;
    *(undefined1 *)&pTVar12[2].order = R;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::ostream::operator<<(local_1a8,iVar8 + local_298._0_4_ + -1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar25 = 0xf;
    if (local_3b0 != (undefined1  [8])&local_3a0) {
      uVar25 = local_3a0;
    }
    if (uVar25 < (ulong)(local_358.m_data._8_8_ + (long)uStack_3a8)) {
      uVar25 = 0xf;
      if ((ulong *)local_358.m_data._0_8_ != local_348) {
        uVar25 = local_348[0];
      }
      if (uVar25 < (ulong)(local_358.m_data._8_8_ + (long)uStack_3a8)) goto LAB_003f8028;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_358,0,(char *)0x0,(ulong)local_3b0);
    }
    else {
LAB_003f8028:
      puVar11 = (undefined8 *)std::__cxx11::string::_M_append(local_3b0,local_358.m_data._0_8_);
    }
    local_2f8 = &local_2e8;
    plVar2 = puVar11 + 2;
    if ((long *)*puVar11 == plVar2) {
      local_2e8 = *plVar2;
      uStack_2e0 = puVar11[3];
    }
    else {
      local_2e8 = *plVar2;
      local_2f8 = (long *)*puVar11;
    }
    local_2f0 = puVar11[1];
    *puVar11 = plVar2;
    puVar11[1] = 0;
    *(undefined1 *)plVar2 = 0;
    if ((ulong *)local_358.m_data._0_8_ != local_348) {
      operator_delete((void *)local_358.m_data._0_8_,local_348[0] + 1);
    }
    if (local_3b0 != (undefined1  [8])&local_3a0) {
      operator_delete((void *)local_3b0,local_3a0 + 1);
    }
    if (local_338 != &local_328) {
      operator_delete(local_338,local_328 + 1);
    }
    if ((ulong *)CONCAT44(uStack_314,local_318.m_value) != local_308) {
      operator_delete((ulong *)CONCAT44(uStack_314,local_318.m_value),local_308[0] + 1);
    }
    if (local_378 != local_368) {
      operator_delete(local_378,local_368[0] + 1);
    }
    glu::CallLogWrapper::glClear(local_380,0x4000);
    glu::CallLogWrapper::glVertexAttribPointer
              (local_380,this->m_byteVecLoc,3,0x1401,'\x01',0,(void *)(long)iVar8);
    glu::CallLogWrapper::glDrawElements
              (local_380,4,uVar9 * 6,0x1403,
               local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
               .super__Vector_impl_data._M_start);
    iVar8 = (int)local_248;
    iVar20 = iVar8 * 8;
    tcu::Surface::setSize
              (&local_240,iVar20,(((int)uVar9 / iVar8 + 1) - (uint)((int)uVar9 % iVar8 == 0)) * 8);
    local_3b0._0_4_ = RGBA;
    local_3b0._4_4_ = UNORM_INT8;
    pvVar27 = (void *)local_240.m_pixels.m_cap;
    if ((void *)local_240.m_pixels.m_cap != (void *)0x0) {
      pvVar27 = local_240.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1a8,(TextureFormat *)local_3b0,local_240.m_width,
               local_240.m_height,1,pvVar27);
    local_3b0._0_4_ = R;
    local_3b0._4_4_ = SNORM_INT8;
    uStack_3a8._0_4_ = 0;
    uStack_3a8._4_4_ = 0xff;
    tcu::clear((PixelBufferAccess *)local_1a8,(IVec4 *)local_3b0);
    local_2a8 = iVar20;
    if (0xb < (int)local_298._0_4_) {
      local_208 = local_260 + (int)local_288._0_4_;
      local_210 = (ulong)uVar9;
      uVar25 = 0;
      do {
        puVar6 = local_208;
        lVar4 = (long)(int)local_248;
        uVar5 = (ulong)(uint)((int)uVar25 >> 0x1f) << 0x20 | uVar25 & 0xffffffff;
        local_2b8 = (long)uVar5 / lVar4 & 0xffffffff;
        lVar21 = (uVar25 << 0x22) + (uVar25 << 0x23);
        lVar28 = lVar21 >> 0x20;
        local_338 = (long *)(CONCAT44(local_338._4_4_,
                                      (uint)CONCAT12(local_208[lVar28 + 2],
                                                     *(undefined2 *)(local_208 + lVar28))) |
                            0xff000000);
        local_200 = uVar25;
        tcu::RGBA::toVec((RGBA *)local_3b0);
        local_378 = (ulong *)(CONCAT44(local_378._4_4_,
                                       (uint)CONCAT12(puVar6[lVar28 + 5],
                                                      *(undefined2 *)(puVar6 + lVar28 + 3))) |
                             0xff000000);
        tcu::RGBA::toVec((RGBA *)&local_338);
        lVar28 = lVar21 + 0x600000000 >> 0x20;
        local_318.m_value =
             CONCAT12(puVar6[lVar28 + 2],*(undefined2 *)(puVar6 + lVar28)) | 0xff000000;
        tcu::RGBA::toVec((RGBA *)&local_378);
        lVar21 = lVar21 + 0x900000000 >> 0x20;
        local_358.m_data._0_8_ =
             CONCAT44(local_358.m_data[1],
                      (uint)CONCAT12(puVar6[lVar21 + 2],*(undefined2 *)(puVar6 + lVar21))) |
             0xff000000;
        tcu::RGBA::toVec(&local_318);
        local_2b8 = (ulong)(uint)((int)local_2b8 << 3);
        iVar8 = 0;
        do {
          fVar29 = ((float)iVar8 + 0.5) * 0.125;
          local_298 = ZEXT416((uint)(1.0 - fVar29));
          iVar20 = (int)local_2b8;
          iVar22 = 0;
          local_288 = ZEXT416((uint)fVar29);
          do {
            fVar31 = ((float)iVar22 + 0.5) * 0.125;
            fVar30 = fVar29 + fVar31;
            pRVar13 = &local_318;
            if (fVar30 <= 1.0) {
              pRVar13 = (RGBA *)local_3b0;
            }
            pRVar15 = (RGBA *)&local_338;
            if (fVar30 <= 1.0) {
              pRVar15 = (RGBA *)&local_378;
            }
            local_1f8[8] = 0.0;
            local_1f8[9] = 0.0;
            local_1f8[10] = 0.0;
            local_1f8[0xb] = 0.0;
            lVar21 = 0;
            do {
              local_1f8[lVar21 + 8] =
                   (float)pRVar15[lVar21].m_value - (float)pRVar13[lVar21].m_value;
              lVar21 = lVar21 + 1;
            } while (lVar21 != 4);
            local_1f8[0xc] = 0.0;
            local_1f8[0xd] = 0.0;
            local_1f8[0xe] = 0.0;
            local_1f8[0xf] = 0.0;
            lVar21 = 0;
            do {
              local_1f8[lVar21 + 0xc] =
                   local_1f8[lVar21 + 8] *
                   (float)(~-(uint)(fVar30 <= 1.0) & (uint)(1.0 - fVar31) |
                          (uint)fVar31 & -(uint)(fVar30 <= 1.0));
              lVar21 = lVar21 + 1;
            } while (lVar21 != 4);
            local_1f8[0x10] = 0.0;
            local_1f8[0x11] = 0.0;
            local_1f8[0x12] = 0.0;
            local_1f8[0x13] = 0.0;
            lVar21 = 0;
            do {
              local_1f8[lVar21 + 0x10] = (float)pRVar13[lVar21].m_value + local_1f8[lVar21 + 0xc];
              lVar21 = lVar21 + 1;
            } while (lVar21 != 4);
            pRVar15 = (RGBA *)&local_378;
            if (fVar30 <= 1.0) {
              pRVar15 = (RGBA *)&local_338;
            }
            local_1f8[0] = 0.0;
            local_1f8[1] = 0.0;
            local_1f8[2] = 0.0;
            local_1f8[3] = 0.0;
            lVar21 = 0;
            do {
              local_1f8[lVar21] = (float)pRVar15[lVar21].m_value - (float)pRVar13[lVar21].m_value;
              lVar21 = lVar21 + 1;
            } while (lVar21 != 4);
            local_1f8[4] = 0.0;
            local_1f8[5] = 0.0;
            local_1f8[6] = 0.0;
            local_1f8[7] = 0.0;
            lVar21 = 0;
            do {
              local_1f8[lVar21 + 4] =
                   local_1f8[lVar21] *
                   (float)(~-(uint)(fVar30 <= 1.0) & local_298._0_4_ |
                          -(uint)(fVar30 <= 1.0) & (uint)fVar29);
              lVar21 = lVar21 + 1;
            } while (lVar21 != 4);
            local_358.m_data._0_8_ = (ulong *)0x0;
            local_358.m_data[2] = 0.0;
            local_358.m_data[3] = 0.0;
            lVar21 = 0;
            do {
              local_358.m_data[lVar21] = local_1f8[lVar21 + 0x10] + local_1f8[lVar21 + 4];
              lVar21 = lVar21 + 1;
            } while (lVar21 != 4);
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)local_1a8,&local_358,
                       (int)((long)uVar5 % lVar4) * 8 + iVar22,iVar20 + iVar8,0);
            iVar22 = iVar22 + 1;
            fVar29 = (float)local_288._0_4_;
          } while (iVar22 != 8);
          iVar8 = iVar8 + 1;
        } while (iVar8 != 8);
        uVar25 = local_200 + 1;
      } while (uVar25 != local_210);
    }
    tcu::Surface::setSize(&local_228,local_2a8,local_2a0 << 3);
    context = ((this->super_BufferVerifierBase).m_context)->m_renderCtx;
    local_3b0._0_4_ = RGBA;
    local_3b0._4_4_ = UNORM_INT8;
    pvVar27 = (void *)local_228.m_pixels.m_cap;
    if ((void *)local_228.m_pixels.m_cap != (void *)0x0) {
      pvVar27 = local_228.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1a8,(TextureFormat *)local_3b0,local_228.m_width,
               local_228.m_height,1,pvVar27);
    glu::readPixels(context,0,0,(PixelBufferAccess *)local_1a8);
    bVar7 = tcu::pixelThresholdCompare
                      (((this->super_BufferVerifierBase).m_context)->m_testCtx->m_log,"RenderResult"
                       ,(char *)local_2f8,&local_240,&local_228,&local_29c,COMPARE_LOG_RESULT);
    local_3b4 = local_3b4 & 0xff;
    uVar17 = local_38c;
    if (!bVar7) {
      local_3b4 = 0;
      uVar17 = 0;
    }
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8,local_2e8 + 1);
    }
    uVar17 = local_2a4 + uVar17;
  } while (bVar7);
  pCVar1 = local_380;
  glu::CallLogWrapper::glDisableVertexAttribArray(local_380,this->m_posLoc);
  glu::CallLogWrapper::glDisableVertexAttribArray(pCVar1,this->m_byteVecLoc);
  tcu::Surface::~Surface(&local_240);
  tcu::Surface::~Surface(&local_228);
  if (local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2d8.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2d8.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2d8.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2d8.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_3b4;
}

Assistant:

bool VertexArrayVerifier::verify (deUint32 buffer, const deUint8* refPtr, int offset, int numBytes)
{
	const tcu::RenderTarget&	renderTarget		= m_context.getRenderContext().getRenderTarget();
	const int					numBytesInVtx		= 3;
	const int					numBytesInQuad		= numBytesInVtx*4;
	int							maxQuadsX			= de::min(128, renderTarget.getWidth()	/ VERIFY_QUAD_SIZE);
	int							maxQuadsY			= de::min(128, renderTarget.getHeight()	/ VERIFY_QUAD_SIZE);
	int							maxQuadsPerBatch	= maxQuadsX*maxQuadsY;
	int							numVerified			= 0;
	deUint32					program				= m_program->getProgram();
	tcu::RGBA					threshold			= renderTarget.getPixelFormat().getColorThreshold() + tcu::RGBA(4,4,4,4);
	bool						isOk				= true;

	vector<tcu::Vec2>			positions;
	vector<deUint16>			indices;

	tcu::Surface				rendered;
	tcu::Surface				reference;

	DE_ASSERT(numBytes >= numBytesInQuad); // Can't render full quad with smaller buffers.

	computePositions(positions, maxQuadsX, maxQuadsY);
	computeIndices(indices, maxQuadsX, maxQuadsY);

	// Reset buffer bindings.
	glBindBuffer				(GL_ELEMENT_ARRAY_BUFFER,	0);
	glBindBuffer				(GL_ARRAY_BUFFER,			0);

	// Setup rendering state.
	glViewport					(0, 0, maxQuadsX*VERIFY_QUAD_SIZE, maxQuadsY*VERIFY_QUAD_SIZE);
	glClearColor				(0.0f, 0.0f, 0.0f, 1.0f);
	glUseProgram				(program);
	glEnableVertexAttribArray	(m_posLoc);
	glVertexAttribPointer		(m_posLoc, 2, GL_FLOAT, GL_FALSE, 0, &positions[0]);
	glEnableVertexAttribArray	(m_byteVecLoc);
	glBindBuffer				(GL_ARRAY_BUFFER, buffer);

	while (numVerified < numBytes)
	{
		int		numRemaining		= numBytes-numVerified;
		bool	isLeftoverBatch		= numRemaining < numBytesInQuad;
		int		numBytesToVerify	= isLeftoverBatch ? numBytesInQuad				: de::min(maxQuadsPerBatch*numBytesInQuad, numRemaining - numRemaining%numBytesInQuad);
		int		curOffset			= isLeftoverBatch ? (numBytes-numBytesInQuad)	: numVerified;
		int		numQuads			= numBytesToVerify/numBytesInQuad;
		int		numCols				= de::min(maxQuadsX, numQuads);
		int		numRows				= numQuads/maxQuadsX + (numQuads%maxQuadsX != 0 ? 1 : 0);
		string	imageSetDesc		= string("Bytes ") + de::toString(offset+curOffset) + " to " + de::toString(offset+curOffset+numBytesToVerify-1);

		DE_ASSERT(numBytesToVerify > 0 && numBytesToVerify%numBytesInQuad == 0);
		DE_ASSERT(de::inBounds(curOffset, 0, numBytes));
		DE_ASSERT(de::inRange(curOffset+numBytesToVerify, curOffset, numBytes));

		// Render batch.
		glClear					(GL_COLOR_BUFFER_BIT);
		glVertexAttribPointer	(m_byteVecLoc, 3, GL_UNSIGNED_BYTE, GL_TRUE, 0, (const glw::GLvoid*)(deUintptr)(offset + curOffset));
		glDrawElements			(GL_TRIANGLES, numQuads*6, GL_UNSIGNED_SHORT, &indices[0]);

		renderQuadGridReference(reference,  numQuads, numCols, refPtr + offset + curOffset);

		rendered.setSize(numCols*VERIFY_QUAD_SIZE, numRows*VERIFY_QUAD_SIZE);
		glu::readPixels(m_context.getRenderContext(), 0, 0, rendered.getAccess());

		if (!tcu::pixelThresholdCompare(m_context.getTestContext().getLog(), "RenderResult", imageSetDesc.c_str(), reference, rendered, threshold, tcu::COMPARE_LOG_RESULT))
		{
			isOk = false;
			break;
		}

		numVerified += isLeftoverBatch ? numRemaining : numBytesToVerify;
	}

	glDisableVertexAttribArray	(m_posLoc);
	glDisableVertexAttribArray	(m_byteVecLoc);

	return isOk;
}